

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamIteratorInterface<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
::Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
  *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<std::tuple<long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_long_(*)(const_int_*,_const_int_*,_long,_long_*,_int),_aom_bit_depth>_>
            *)operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_010a58e8;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }